

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCacheClear(Parse *pParse)

{
  byte bVar1;
  int iVar2;
  int local_14;
  int i;
  Parse *pParse_local;
  
  for (local_14 = 0; local_14 < (int)(uint)pParse->nColCache; local_14 = local_14 + 1) {
    if ((pParse->aColCache[local_14].tempReg != '\0') && (pParse->nTempReg < 8)) {
      iVar2 = pParse->aColCache[local_14].iReg;
      bVar1 = pParse->nTempReg;
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = iVar2;
    }
  }
  pParse->nColCache = '\0';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheClear(Parse *pParse){
  int i;

#ifdef SQLITE_DEBUG
  if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
    printf("CLEAR\n");
  }
#endif
  for(i=0; i<pParse->nColCache; i++){
    if( pParse->aColCache[i].tempReg
     && pParse->nTempReg<ArraySize(pParse->aTempReg)
    ){
       pParse->aTempReg[pParse->nTempReg++] = pParse->aColCache[i].iReg;
    }
  }
  pParse->nColCache = 0;
}